

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> * __thiscall
testing::internal::
OnCallSpec<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>::GetAction
          (OnCallSpec<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *this
          )

{
  int iVar1;
  allocator local_31;
  string local_30;
  OnCallSpec<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *local_10;
  OnCallSpec<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *this_local;
  
  iVar1 = *(int *)(this + 0xc);
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_30,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_31);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return (Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *)
         (this + 0x40);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }